

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConditionalAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConditionalAssertionExpr,slang::ast::Expression_const&,slang::ast::AssertionExpr_const&,slang::ast::AssertionExpr_const*&>
          (BumpAllocator *this,Expression *args,AssertionExpr *args_1,AssertionExpr **args_2)

{
  AssertionExpr *pAVar1;
  ConditionalAssertionExpr *pCVar2;
  
  pCVar2 = (ConditionalAssertionExpr *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConditionalAssertionExpr *)this->endPtr < pCVar2 + 1) {
    pCVar2 = (ConditionalAssertionExpr *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pCVar2 + 1);
  }
  pAVar1 = *args_2;
  (pCVar2->super_AssertionExpr).kind = Conditional;
  (pCVar2->super_AssertionExpr).syntax = (SyntaxNode *)0x0;
  pCVar2->condition = args;
  pCVar2->ifExpr = args_1;
  pCVar2->elseExpr = pAVar1;
  return pCVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }